

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_ApplyHandoffRemovesUnsupportedCiphers_Test::TestBody
          (SSLTest_ApplyHandoffRemovesUnsupportedCiphers_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  SSL *s;
  OPENSSL_STACK *pOVar2;
  AssertHelper *pAVar3;
  pointer *__ptr_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  Span<const_unsigned_char> handoff_00;
  UniquePtr<SSL> server;
  UniquePtr<SSL_CTX> server_ctx;
  uint8_t handoff [157];
  AssertHelper local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  _Head_base<0UL,_ssl_st_*,_false> local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  AssertHelper local_c8;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_c0;
  undefined1 local_b8 [168];
  
  pAVar3 = &local_108;
  meth = (SSL_METHOD *)TLS_method();
  local_c0._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  local_e8[0] = (internal)
                ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                 local_c0._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      local_c0._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_e8,(AssertionResult *)"server_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1902,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    goto LAB_001aca6f;
  }
  s = SSL_new((SSL_CTX *)
              local_c0._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_e8[0] = (internal)(s != (SSL *)0x0);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f0._M_head_impl = (ssl_st *)s;
  if (s == (SSL *)0x0) {
    testing::Message::Message((Message *)&local_100);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_e0;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_e8,(AssertionResult *)0x34aa75,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1904,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    __ptr_00 = local_e0;
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
      __ptr_00 = local_e0;
    }
LAB_001aca02:
    if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_001aca60:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,__ptr_00);
    }
  }
  else {
    memcpy(local_b8,&DAT_0032f5c0,0x9d);
    local_108.data_._0_4_ = 1;
    pOVar2 = (OPENSSL_STACK *)SSL_get_ciphers(s);
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         OPENSSL_sk_num(pOVar2);
    testing::internal::CmpHelperLT<unsigned_int,unsigned_long>
              ((internal *)local_e8,"1u","sk_SSL_CIPHER_num(SSL_get_ciphers(server.get()))",
               (uint *)&local_108,(unsigned_long *)&local_100);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_e0->_M_dataplus)._M_p;
      }
      pAVar3 = (AssertHelper *)0x1922;
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1922,pcVar4);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    handoff_00.size_ = (size_t)pAVar3;
    handoff_00.data_ = (uchar *)0x9d;
    bVar1 = SSL_apply_handoff((bssl *)local_f0._M_head_impl,(SSL *)local_b8,handoff_00);
    local_100._M_head_impl._0_1_ = bVar1;
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_108);
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_f8;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e8,(internal *)&local_100,
                 (AssertionResult *)
                 "SSL_apply_handoff(server.get(), {handoff, (sizeof(handoff) / sizeof((handoff)[0]))})"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1924,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
      }
      __ptr_00 = local_f8;
      if ((long *)CONCAT44(local_108.data_._4_4_,local_108.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_108.data_._4_4_,local_108.data_._0_4_) + 8))();
        __ptr_00 = local_f8;
      }
      goto LAB_001aca02;
    }
    local_108.data_._0_4_ = 1;
    pOVar2 = (OPENSSL_STACK *)SSL_get_ciphers((SSL *)local_f0._M_head_impl);
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         OPENSSL_sk_num(pOVar2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_e8,"1u","sk_SSL_CIPHER_num(SSL_get_ciphers(server.get()))",
               (uint *)&local_108,(unsigned_long *)&local_100);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1925,pcVar4);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_e0;
      __ptr_00 = local_e0;
      goto LAB_001aca60;
    }
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_f0);
LAB_001aca6f:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_c0);
  return;
}

Assistant:

TEST(SSLTest, ApplyHandoffRemovesUnsupportedCiphers) {
  bssl::UniquePtr<SSL_CTX> server_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL> server(SSL_new(server_ctx.get()));
  ASSERT_TRUE(server);

  // handoff is a handoff message that has been artificially modified to pretend
  // that only TLS_ECDHE_RSA_WITH_AES_128_GCM_SHA256 (0xc02f) is supported. When
  // it is applied to |server|, all ciphers but that one should be removed.
  //
  // To make a new one of these, try sticking this in the |Handoff| test above:
  //
  // hexdump(stderr, "", handoff.data(), handoff.size());
  // sed -e 's/\(..\)/0x\1, /g'
  //
  // and modify serialize_features() to emit only cipher 0x0A.

  uint8_t handoff[] = {
      0x30, 0x81, 0x9a, 0x02, 0x01, 0x00, 0x04, 0x00, 0x04, 0x81, 0x82, 0x01,
      0x00, 0x00, 0x7e, 0x03, 0x03, 0x30, 0x8e, 0x8f, 0x79, 0xd2, 0x87, 0x39,
      0xc2, 0x23, 0x23, 0x13, 0xca, 0x3c, 0x80, 0x44, 0xfd, 0x80, 0x83, 0x62,
      0x3c, 0xcc, 0xf8, 0x76, 0xd3, 0x62, 0xbb, 0x54, 0xe3, 0xc4, 0x39, 0x24,
      0xa5, 0x00, 0x00, 0x1e, 0xc0, 0x2b, 0xc0, 0x2f, 0xc0, 0x2c, 0xc0, 0x30,
      0xcc, 0xa9, 0xcc, 0xa8, 0xc0, 0x09, 0xc0, 0x13, 0xc0, 0x0a, 0xc0, 0x14,
      0x00, 0x9c, 0x00, 0x9d, 0x00, 0x2f, 0x00, 0x35, 0x00, 0x0a, 0x01, 0x00,
      0x00, 0x37, 0x00, 0x17, 0x00, 0x00, 0xff, 0x01, 0x00, 0x01, 0x00, 0x00,
      0x0a, 0x00, 0x08, 0x00, 0x06, 0x00, 0x1d, 0x00, 0x17, 0x00, 0x18, 0x00,
      0x0b, 0x00, 0x02, 0x01, 0x00, 0x00, 0x23, 0x00, 0x00, 0x00, 0x0d, 0x00,
      0x14, 0x00, 0x12, 0x04, 0x03, 0x08, 0x04, 0x04, 0x01, 0x05, 0x03, 0x08,
      0x05, 0x05, 0x01, 0x08, 0x06, 0x06, 0x01, 0x02, 0x01, 0x04, 0x02, 0xc0,
      0x2f, 0x04, 0x0a, 0x00, 0x15, 0x00, 0x17, 0x00, 0x18, 0x00, 0x19, 0x00,
      0x1d,
  };

  EXPECT_LT(1u, sk_SSL_CIPHER_num(SSL_get_ciphers(server.get())));
  ASSERT_TRUE(
      SSL_apply_handoff(server.get(), {handoff, OPENSSL_ARRAY_SIZE(handoff)}));
  EXPECT_EQ(1u, sk_SSL_CIPHER_num(SSL_get_ciphers(server.get())));
}